

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TracingServiceState_Producer::Serialize
          (TracingServiceState_Producer *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  TracingServiceState_Producer *this_local;
  
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,1,this->id_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendString(msg,2,&this->name_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,5,this->pid_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,3,this->uid_);
  }
  bVar1 = std::bitset<6UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendString(msg,4,&this->sdk_version_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void TracingServiceState_Producer::Serialize(::protozero::Message* msg) const {
  // Field 1: id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, id_);
  }

  // Field 2: name
  if (_has_field_[2]) {
    msg->AppendString(2, name_);
  }

  // Field 5: pid
  if (_has_field_[5]) {
    msg->AppendVarInt(5, pid_);
  }

  // Field 3: uid
  if (_has_field_[3]) {
    msg->AppendVarInt(3, uid_);
  }

  // Field 4: sdk_version
  if (_has_field_[4]) {
    msg->AppendString(4, sdk_version_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}